

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O0

schar acurr(int x)

{
  int local_28;
  schar local_24;
  schar local_20;
  int local_1c;
  int local_18;
  int tmp;
  int x_local;
  
  local_28 = (int)u.abon.a[x] + (int)u.atemp.a[x] + (int)u.acurr.a[x];
  if (x == 0) {
    if (local_28 < 0x7d) {
      local_1c = local_28;
      if (local_28 < 4) {
        local_1c = 3;
      }
      local_18 = local_1c;
    }
    else {
      local_18 = 0x7d;
    }
    if ((((((uarmu == (obj *)0x0) || ((uarmu->oprops & 0x80U) == 0)) &&
          (((uarm == (obj *)0x0 || ((uarm->oprops & 0x80U) == 0)) &&
           ((uarmc == (obj *)0x0 || ((uarmc->oprops & 0x80U) == 0)))))) &&
         (((uarmg == (obj *)0x0 || (((uarmg->oprops & 0x80U) == 0 && (uarmg->otyp != 0x91)))) &&
          (((uarms == (obj *)0x0 || ((uarms->oprops & 0x80U) == 0)) &&
           ((uarmh == (obj *)0x0 || ((uarmh->oprops & 0x80U) == 0)))))))) &&
        ((uarmf == (obj *)0x0 || ((uarmf->oprops & 0x80U) == 0)))) &&
       ((((uleft == (obj *)0x0 || ((uleft->oprops & 0x80U) == 0)) &&
         ((uright == (obj *)0x0 || ((uright->oprops & 0x80U) == 0)))) &&
        ((uamul == (obj *)0x0 || ((uamul->oprops & 0x80U) == 0)))))) {
      tmp._3_1_ = (schar)local_18;
      if ((uwep != (obj *)0x0) && (uwep->oartifact == '\x11')) {
        local_20 = tmp._3_1_;
        if (local_18 < 0x76) {
          local_20 = 'v';
        }
        tmp._3_1_ = local_20;
      }
    }
    else {
      tmp._3_1_ = '}';
    }
  }
  else {
    if (x == 5) {
      if ((local_28 < 0x12) &&
         ((((youmonst.data)->mlet == '\x0e' || (u.umonnum == 0x12f)) || (u.umonnum == 0x130)))) {
        return '\x12';
      }
    }
    else if ((((x == 1) || (x == 2)) && (uarmh != (obj *)0x0)) && (uarmh->otyp == 0x4d)) {
      return '\x06';
    }
    if (local_28 < 0x19) {
      if (local_28 < 4) {
        local_28 = 3;
      }
      local_24 = (schar)local_28;
    }
    else {
      local_24 = '\x19';
    }
    tmp._3_1_ = local_24;
  }
  return tmp._3_1_;
}

Assistant:

schar acurr(int x)
{
	int tmp = (u.abon.a[x] + u.atemp.a[x] + u.acurr.a[x]);

	if (x == A_STR) {
		tmp = (tmp >= 125) ? 125 : ((tmp <= 3) ? 3 : tmp);
		if ((uarmu && (uarmu->oprops & ITEM_POWER)) ||
		    (uarm && (uarm->oprops & ITEM_POWER)) ||
		    (uarmc && (uarmc->oprops & ITEM_POWER)) ||
		    (uarmg && ((uarmg->oprops & ITEM_POWER) ||
			       uarmg->otyp == GAUNTLETS_OF_POWER)) ||
		    (uarms && (uarms->oprops & ITEM_POWER)) ||
		    (uarmh && (uarmh->oprops & ITEM_POWER)) ||
		    (uarmf && (uarmf->oprops & ITEM_POWER)) ||
		    (uleft && (uleft->oprops & ITEM_POWER)) ||
		    (uright && (uright->oprops & ITEM_POWER)) ||
		    (uamul && (uamul->oprops & ITEM_POWER)))
		    return 125;
		else if (uwep && uwep->oartifact == ART_GIANTSLAYER)
		    return (schar)(tmp < 118 ? 118 : tmp);
		else return (schar)tmp;
	} else if (x == A_CHA) {
		if (tmp < 18 && (youmonst.data->mlet == S_NYMPH ||
		    u.umonnum==PM_SUCCUBUS || u.umonnum == PM_INCUBUS))
		    return 18;
	} else if (x == A_INT || x == A_WIS) {
		/* yes, this may raise int/wis if player is sufficiently
		 * stupid.  there are lower levels of cognition than "dunce".
		 */
		if (uarmh && uarmh->otyp == DUNCE_CAP) return 6;
	}
	return (schar)((tmp >= 25) ? 25 : (tmp <= 3) ? 3 : tmp);
}